

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O3

void Fra_ClassNodesMark(Fra_Lcr_t *p)

{
  ulong *puVar1;
  int iVar2;
  Fra_Cla_t *pFVar3;
  long lVar4;
  uint uVar5;
  Vec_Ptr_t *pVVar6;
  undefined8 *puVar7;
  int *piVar8;
  
  pFVar3 = p->pCla;
  pVVar6 = pFVar3->vClasses1;
  iVar2 = pFVar3->pAig->nObjs[3] - pFVar3->pAig->nObjs[2];
  if (0 < pVVar6->nSize) {
    lVar4 = 0;
    do {
      uVar5 = *pVVar6->pArray[lVar4] + iVar2;
      if (((int)uVar5 < 0) || (pVVar6 = pFVar3->pAig->vCos, pVVar6->nSize <= (int)uVar5)) {
LAB_006063b0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (ulong *)((long)pVVar6->pArray[uVar5] + 0x18);
      *puVar1 = *puVar1 | 0x10;
      lVar4 = lVar4 + 1;
      pFVar3 = p->pCla;
      pVVar6 = pFVar3->vClasses1;
    } while (lVar4 < pVVar6->nSize);
  }
  pVVar6 = pFVar3->vClasses;
  if (0 < pVVar6->nSize) {
    lVar4 = 0;
    do {
      puVar7 = (undefined8 *)pVVar6->pArray[lVar4];
      piVar8 = (int *)*puVar7;
      if (piVar8 != (int *)0x0) {
        do {
          puVar7 = puVar7 + 1;
          uVar5 = *piVar8 + iVar2;
          if (((int)uVar5 < 0) || (pVVar6 = p->pCla->pAig->vCos, pVVar6->nSize <= (int)uVar5))
          goto LAB_006063b0;
          puVar1 = (ulong *)((long)pVVar6->pArray[uVar5] + 0x18);
          *puVar1 = *puVar1 | 0x10;
          piVar8 = (int *)*puVar7;
        } while (piVar8 != (int *)0x0);
        pFVar3 = p->pCla;
      }
      lVar4 = lVar4 + 1;
      pVVar6 = pFVar3->vClasses;
    } while (lVar4 < pVVar6->nSize);
  }
  return;
}

Assistant:

void Fra_ClassNodesMark( Fra_Lcr_t * p )
{
    Aig_Obj_t * pObj, ** ppClass;
    int i, c, Offset;
    // compute the LO/LI offset
    Offset = Aig_ManCoNum(p->pCla->pAig) - Aig_ManCiNum(p->pCla->pAig);
    // mark the nodes remaining in the classes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->pCla->vClasses1, pObj, i )
    {
        pObj = Aig_ManCo( p->pCla->pAig, Offset+(long)pObj->pNext );
        pObj->fMarkA = 1;
    }
    Vec_PtrForEachEntry( Aig_Obj_t **, p->pCla->vClasses, ppClass, i )
    {
        for ( c = 0; ppClass[c]; c++ )
        {
            pObj = Aig_ManCo( p->pCla->pAig, Offset+(long)ppClass[c]->pNext );
            pObj->fMarkA = 1;
        }
    }
}